

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::UsingImplicitWeakDescriptor
               (FileDescriptor *file,Options *options)

{
  bool bVar1;
  FileOptions_OptimizeMode FVar2;
  byte bVar3;
  
  bVar3 = 0;
  FVar2 = GetOptimizeFor(file,options,(bool *)0x0);
  if (FVar2 != FileOptions_OptimizeMode_LITE_RUNTIME) {
    bVar1 = IsBootstrapProto(options,file);
    if ((bVar1) || (options->descriptor_implicit_weak_messages != true)) {
      bVar3 = 0;
    }
    else {
      bVar3 = options->opensource_runtime ^ 1;
    }
  }
  return (bool)bVar3;
}

Assistant:

bool UsingImplicitWeakDescriptor(const FileDescriptor* file,
                                 const Options& options) {
  return HasDescriptorMethods(file, options) &&
         !IsBootstrapProto(options, file) &&
         options.descriptor_implicit_weak_messages &&
         !options.opensource_runtime;
}